

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.h
# Opt level: O1

strong_ordering QUuid::compareThreeWay_helper(QUuid *lhs,QUuid *rhs)

{
  byte bVar1;
  long lVar2;
  
  bVar1 = -(lhs->data1 < rhs->data1) | 1;
  if (((lhs->data1 == rhs->data1) &&
      (bVar1 = -(lhs->data2 < rhs->data2) | 1, lhs->data2 == rhs->data2)) &&
     (bVar1 = -(lhs->data3 < rhs->data3) | 1, lhs->data3 == rhs->data3)) {
    lVar2 = 0;
    do {
      if (lhs->data4[lVar2] != rhs->data4[lVar2]) {
        return (strong_ordering)(-(lhs->data4[lVar2] < rhs->data4[lVar2]) | 1);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    bVar1 = 0;
  }
  return (strong_ordering)bVar1;
}

Assistant:

static constexpr Qt::strong_ordering
    compareThreeWay_helper(const QUuid &lhs, const QUuid &rhs) noexcept
    {
#if QT_VERSION < QT_VERSION_CHECK(7, 0, 0) && !defined(QT_BOOTSTRAPPED)
        if (const auto c = Qt::compareThreeWay(lhs.data1, rhs.data1); !is_eq(c))
            return c;
        if (const auto c = Qt::compareThreeWay(lhs.data2, rhs.data2); !is_eq(c))
            return c;
        if (const auto c = Qt::compareThreeWay(lhs.data3, rhs.data3); !is_eq(c))
            return c;
#elif defined(__cpp_lib_bit_cast) && defined(QT_SUPPORTS_INT128)
        quint128 lu = qFromBigEndian(std::bit_cast<quint128>(lhs));
        quint128 ru = qFromBigEndian(std::bit_cast<quint128>(rhs));
        return Qt::compareThreeWay(lu, ru);
#else
        auto make_int = [](const QUuid &u) {
            quint64 result = quint64(u.data3) << 48;
            result |= quint64(u.data2) << 32;
            return qFromBigEndian(result | u.data1);
        };
        if (const auto c = Qt::compareThreeWay(make_int(lhs), make_int(rhs)); !is_eq(c))
            return c;
#endif
        for (unsigned i = 0; i < sizeof(lhs.data4); ++i) {
            if (const auto c = Qt::compareThreeWay(lhs.data4[i], rhs.data4[i]); !is_eq(c))
                return c;
        }
        return Qt::strong_ordering::equal;
    }